

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapSecure::Connect
          (CoapSecure *this,ConnectHandler *aOnConnected,string *aPeerAddr,uint16_t aPeerPort)

{
  bool bVar1;
  element_type *this_00;
  int *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> local_198;
  anon_class_1_0_00000001 local_162;
  v10 local_161;
  v10 *local_160;
  char *local_158;
  string local_150;
  Error local_130;
  int local_108;
  undefined1 local_102 [2];
  int fail;
  uint16_t aPeerPort_local;
  string *aPeerAddr_local;
  ConnectHandler *aOnConnected_local;
  CoapSecure *this_local;
  undefined1 local_b0 [16];
  v10 *local_a0;
  char *local_98;
  unsigned_short *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 **local_60;
  v10 *local_58;
  char *pcStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
  *local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
  *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
  *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  v10 *local_18;
  v10 **local_10;
  
  local_102 = (undefined1  [2])aPeerPort;
  _fail = aPeerAddr;
  aPeerAddr_local = (string *)aOnConnected;
  aOnConnected_local = (ConnectHandler *)this;
  this_00 = std::
            __shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_108 = UdpSocket::Connect(this_00,_fail,(uint16_t)local_102);
  if ((local_108 == 0) || (bVar1 = std::operator!=(aOnConnected,(nullptr_t)0x0), !bVar1)) {
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              (&local_198,aOnConnected);
    DtlsSession::Connect(&this->mDtlsSession,&local_198);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
              (&local_198);
  }
  else {
    Connect::anon_class_1_0_00000001::operator()(&local_162);
    local_10 = &local_160;
    local_18 = &local_161;
    bVar2 = ::fmt::v10::operator()(local_18);
    local_158 = (char *)bVar2.size_;
    local_160 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_int_&,_FMT_COMPILE_STRING,_0>
              ();
    local_78 = local_160;
    pcStack_70 = local_158;
    local_80 = _fail;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_102;
    local_90 = (unsigned_short *)&local_108;
    local_60 = &local_78;
    local_a0 = local_160;
    local_98 = local_158;
    local_68 = &local_150;
    local_58 = local_a0;
    pcStack_50 = local_98;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,unsigned_short,int>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
                *)&this_local,(v10 *)_fail,local_88,local_90,in_R8);
    local_40 = local_b0;
    local_28 = 0x12d;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&this_local;
    fmt.size_ = 0x12d;
    fmt.data_ = local_98;
    local_48 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
                *)&this_local;
    local_38 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
                *)&this_local;
    local_30 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
                *)&this_local;
    local_20 = local_40;
    ::fmt::v10::vformat_abi_cxx11_(&local_150,local_a0,fmt,args);
    Error::Error(&local_130,kIOError,&local_150);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator()
              (aOnConnected,&this->mDtlsSession,&local_130);
    Error::~Error(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return;
}

Assistant:

void Connect(DtlsSession::ConnectHandler aOnConnected, const std::string &aPeerAddr, uint16_t aPeerPort)
    {
        if (int fail = mSocket->Connect(aPeerAddr, aPeerPort))
        {
            if (aOnConnected != nullptr)
            {
                aOnConnected(mDtlsSession, ERROR_IO_ERROR("connect socket to peer addr={}, port={} failed: {}",
                                                          aPeerAddr, aPeerPort, fail));
                ExitNow();
            }
        }
        mDtlsSession.Connect(aOnConnected);

    exit:
        return;
    }